

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O0

boolean read_text_integer(FILE *file,long *result,int *termchar)

{
  int iVar1;
  ushort **ppuVar2;
  FILE *file_00;
  int *in_RDX;
  undefined8 *in_RSI;
  long val;
  int ch;
  FILE *in_stack_ffffffffffffffd0;
  boolean local_4;
  
  do {
    iVar1 = text_getc(in_stack_ffffffffffffffd0);
    if (iVar1 == -1) {
      *in_RDX = -1;
      return 0;
    }
    ppuVar2 = __ctype_b_loc();
  } while (((*ppuVar2)[iVar1] & 0x2000) != 0);
  ppuVar2 = __ctype_b_loc();
  if (((*ppuVar2)[iVar1] & 0x800) == 0) {
    *in_RDX = iVar1;
    local_4 = 0;
  }
  else {
    file_00 = (FILE *)(long)(iVar1 + -0x30);
    while ((iVar1 = text_getc(file_00), iVar1 != -1 &&
           (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[iVar1] & 0x800) != 0))) {
      file_00 = (FILE *)((long)(iVar1 + -0x30) + (long)file_00 * 10);
    }
    *in_RSI = file_00;
    *in_RDX = iVar1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

LOCAL(boolean)
read_text_integer(FILE *file, long *result, int *termchar)
/* Read an unsigned decimal integer from a file, store it in result */
/* Reads one trailing character after the integer; returns it in termchar */
{
  register int ch;
  register long val;

  /* Skip any leading whitespace, detect EOF */
  do {
    ch = text_getc(file);
    if (ch == EOF) {
      *termchar = ch;
      return FALSE;
    }
  } while (isspace(ch));

  if (!isdigit(ch)) {
    *termchar = ch;
    return FALSE;
  }

  val = ch - '0';
  while ((ch = text_getc(file)) != EOF) {
    if (!isdigit(ch))
      break;
    val *= 10;
    val += ch - '0';
  }
  *result = val;
  *termchar = ch;
  return TRUE;
}